

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

void __thiscall IR::BranchInstr::BranchInstr(BranchInstr *this,bool hasBailOutInfo)

{
  undefined1 *puVar1;
  
  (this->super_Instr).m_noLazyHelperAssert = false;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  (this->super_Instr).highlight = 0;
  puVar1 = &(this->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  (this->super_Instr).field_0x38 = (this->super_Instr).field_0x38 & 0x80 | hasBailOutInfo << 4;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014ea8f8;
  this->field_0x58 = this->field_0x58 & 0xe0;
  this->m_branchTarget = (LabelInstr *)0x0;
  this->m_isMultiBranch = false;
  this->m_isHelperToNonHelperBranch = false;
  this->m_leaveConvToBr = false;
  return;
}

Assistant:

BranchInstr(bool hasBailOutInfo = false) : Instr(hasBailOutInfo), m_branchTarget(nullptr), m_isAirlock(false), m_isSwitchBr(false), m_isOrphanedLeave(false), m_areCmpRegisterFlagsUsedLater(false), m_brFinallyToEarlyExit(false)
    {
#if DBG
        m_isMultiBranch = false;
        m_isHelperToNonHelperBranch = false;
        m_leaveConvToBr = false;
#endif
    }